

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionEvaluator::loadScriptFileInternal(SelectionEvaluator *this,string *filename)

{
  bool bVar1;
  long *plVar2;
  string script;
  char buffer [65535];
  int bufferSize;
  ifstrstream ifs;
  undefined6 in_stack_fffffffffffefd10;
  undefined1 in_stack_fffffffffffefd16;
  undefined1 in_stack_fffffffffffefd17;
  string asStack_102c8 [11];
  undefined1 in_stack_fffffffffffefd43;
  openmode in_stack_fffffffffffefd44;
  char *in_stack_fffffffffffefd48;
  ifstrstream *in_stack_fffffffffffefd50;
  char acStack_102a8 [64];
  string *in_stack_fffffffffffefd98;
  string *in_stack_fffffffffffefda0;
  SelectionEvaluator *in_stack_fffffffffffefda8;
  char local_290 [655];
  byte local_1;
  
  std::__cxx11::string::c_str();
  ifstrstream::ifstrstream
            (in_stack_fffffffffffefd50,in_stack_fffffffffffefd48,in_stack_fffffffffffefd44,
             (bool)in_stack_fffffffffffefd43);
  bVar1 = ifstrstream::is_open((ifstrstream *)0x3c8927);
  if (bVar1) {
    std::__cxx11::string::string(asStack_102c8);
    while( true ) {
      plVar2 = (long *)std::istream::getline(local_290,(long)acStack_102a8);
      in_stack_fffffffffffefd17 =
           std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
      if (!(bool)in_stack_fffffffffffefd17) break;
      std::__cxx11::string::operator+=(asStack_102c8,acStack_102a8);
    }
    in_stack_fffffffffffefd16 =
         loadScript(in_stack_fffffffffffefda8,in_stack_fffffffffffefda0,in_stack_fffffffffffefd98);
    local_1 = in_stack_fffffffffffefd16;
    std::__cxx11::string::~string(asStack_102c8);
  }
  else {
    local_1 = 0;
  }
  ifstrstream::~ifstrstream
            ((ifstrstream *)
             CONCAT17(in_stack_fffffffffffefd17,
                      CONCAT16(in_stack_fffffffffffefd16,in_stack_fffffffffffefd10)));
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionEvaluator::loadScriptFileInternal(const std::string& filename) {
    ifstrstream ifs(filename.c_str());
    if (!ifs.is_open()) { return false; }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string script;
    while (ifs.getline(buffer, bufferSize)) {
      script += buffer;
    }
    return loadScript(filename, script);
  }